

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  SCCAnalyzer *pSVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  CppType CVar5;
  int iVar6;
  FileDescriptor *file;
  const_reference pvVar7;
  ulong uVar8;
  size_type sVar9;
  reference ppFVar10;
  Descriptor *pDVar11;
  FieldOptions *pFVar12;
  OneofDescriptor *pOVar13;
  LogMessage *pLVar14;
  string *psVar15;
  int i_00;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  Hex hex;
  string local_228;
  string local_208;
  LogFinisher local_1e2;
  byte local_1e1;
  LogMessage local_1e0;
  string local_1a8;
  FieldDescriptor *local_188;
  FieldDescriptor *field_2;
  FieldDescriptor *pFStack_178;
  int j_1;
  FieldDescriptor *field_1;
  int j;
  bool has_required_fields;
  OneofDescriptor *oneof;
  undefined1 local_158 [4];
  int i_2;
  LogFinisher local_132;
  byte local_131;
  LogMessage local_130;
  string local_f8;
  FieldDescriptor *local_d8;
  FieldDescriptor *field;
  undefined1 auStack_c8 [4];
  int i_1;
  undefined4 local_c0;
  AlphaNum local_b8;
  string local_88;
  string local_58;
  uint local_38;
  uint local_34;
  uint32 mask;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks;
  Printer *printer_local;
  MessageGenerator *this_local;
  AlphaNum *a;
  
  masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  io::Printer::Print(printer,"bool $classname$::IsInitialized() const {\n","classname",
                     &this->classname_);
  io::Printer::Indent((Printer *)
                      masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  iVar4 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar4) {
    io::Printer::Print((Printer *)
                       masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,
                       "if (!_extensions_.IsInitialized()) {\n  return false;\n}\n\n");
  }
  file = Descriptor::file(this->descriptor_);
  bVar3 = HasFieldPresence(file);
  if (bVar3) {
    RequiredFieldsBitMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&mask,this);
    for (local_34 = 0; uVar8 = (ulong)(int)local_34,
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&mask),
        uVar8 < sVar9; local_34 = local_34 + 1) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&mask,
                          (long)(int)local_34);
      puVar2 = masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      local_38 = *pvVar7;
      if (local_38 != 0) {
        SimpleItoa_abi_cxx11_(&local_58,(protobuf *)(ulong)local_34,i_00);
        strings::Hex::Hex<unsigned_int>((Hex *)auStack_c8,local_38,ZERO_PAD_8);
        hex._12_4_ = 0;
        hex.value = _auStack_c8;
        hex.spec = local_c0;
        strings::AlphaNum::AlphaNum(&local_b8,hex);
        StrCat_abi_cxx11_(&local_88,(protobuf *)&local_b8,a);
        io::Printer::Print((Printer *)puVar2,
                           "if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n","i",
                           &local_58,"mask",&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_58);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&mask);
  }
  for (field._4_4_ = 0; uVar8 = (ulong)field._4_4_,
      sVar9 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), uVar8 < sVar9; field._4_4_ = field._4_4_ + 1) {
    ppFVar10 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::operator[](&this->optimized_order_,(long)field._4_4_);
    local_d8 = *ppFVar10;
    CVar5 = FieldDescriptor::cpp_type(local_d8);
    if ((CVar5 == CPPTYPE_MESSAGE) &&
       (bVar3 = ShouldIgnoreRequiredFieldCheck(local_d8,&this->options_), !bVar3)) {
      pSVar1 = this->scc_analyzer_;
      pDVar11 = FieldDescriptor::message_type(local_d8);
      bVar3 = SCCAnalyzer::HasRequiredFields(pSVar1,pDVar11);
      if (bVar3) {
        bVar3 = FieldDescriptor::is_repeated(local_d8);
        puVar2 = masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (bVar3) {
          FieldName_abi_cxx11_(&local_f8,(cpp *)local_d8,field_00);
          io::Printer::Print((Printer *)puVar2,
                             "if (!::google::protobuf::internal::AllAreInitialized(this->$name$())) return false;\n"
                             ,"name",&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
        else {
          pFVar12 = FieldDescriptor::options(local_d8);
          bVar3 = FieldOptions::weak(pFVar12);
          if (!bVar3) {
            pOVar13 = FieldDescriptor::containing_oneof(local_d8);
            local_131 = 0;
            field_01 = extraout_RDX;
            if (pOVar13 != (OneofDescriptor *)0x0) {
              internal::LogMessage::LogMessage
                        (&local_130,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0x10b6);
              local_131 = 1;
              pLVar14 = internal::LogMessage::operator<<
                                  (&local_130,"CHECK failed: !field->containing_oneof(): ");
              internal::LogFinisher::operator=(&local_132,pLVar14);
              field_01 = extraout_RDX_00;
            }
            if ((local_131 & 1) != 0) {
              internal::LogMessage::~LogMessage(&local_130);
              field_01 = extraout_RDX_01;
            }
            puVar2 = masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            FieldName_abi_cxx11_((string *)local_158,(cpp *)local_d8,field_01);
            io::Printer::Print((Printer *)puVar2,
                               "if (has_$name$()) {\n  if (!this->$name$_->IsInitialized()) return false;\n}\n"
                               ,"name",(string *)local_158);
            std::__cxx11::string::~string((string *)local_158);
          }
        }
      }
    }
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print((Printer *)
                       masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,
                       "if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  oneof._4_4_ = 0;
  do {
    iVar4 = oneof._4_4_;
    iVar6 = Descriptor::oneof_decl_count(this->descriptor_);
    if (iVar6 <= iVar4) {
      io::Printer::Outdent
                ((Printer *)
                 masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print((Printer *)
                         masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,"  return true;\n}\n");
      return;
    }
    _j = Descriptor::oneof_decl(this->descriptor_,oneof._4_4_);
    field_1._7_1_ = 0;
    for (field_1._0_4_ = 0; iVar4 = (int)field_1, iVar6 = OneofDescriptor::field_count(_j),
        iVar4 < iVar6; field_1._0_4_ = (int)field_1 + 1) {
      pFStack_178 = OneofDescriptor::field(_j,(int)field_1);
      CVar5 = FieldDescriptor::cpp_type(pFStack_178);
      if ((CVar5 == CPPTYPE_MESSAGE) &&
         (bVar3 = ShouldIgnoreRequiredFieldCheck(pFStack_178,&this->options_), !bVar3)) {
        pSVar1 = this->scc_analyzer_;
        pDVar11 = FieldDescriptor::message_type(pFStack_178);
        bVar3 = SCCAnalyzer::HasRequiredFields(pSVar1,pDVar11);
        if (bVar3) {
          field_1._7_1_ = 1;
          break;
        }
      }
    }
    puVar2 = masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if ((field_1._7_1_ & 1) != 0) {
      psVar15 = OneofDescriptor::name_abi_cxx11_(_j);
      io::Printer::Print((Printer *)puVar2,"switch ($oneofname$_case()) {\n","oneofname",psVar15);
      io::Printer::Indent((Printer *)
                          masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      for (field_2._4_4_ = 0; iVar4 = field_2._4_4_, iVar6 = OneofDescriptor::field_count(_j),
          puVar2 = masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage, iVar4 < iVar6;
          field_2._4_4_ = field_2._4_4_ + 1) {
        local_188 = OneofDescriptor::field(_j,field_2._4_4_);
        puVar2 = masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        psVar15 = FieldDescriptor::name_abi_cxx11_(local_188);
        UnderscoresToCamelCase(&local_1a8,psVar15,true);
        io::Printer::Print((Printer *)puVar2,"case k$field_name$: {\n","field_name",&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        io::Printer::Indent((Printer *)
                            masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        CVar5 = FieldDescriptor::cpp_type(local_188);
        if ((CVar5 == CPPTYPE_MESSAGE) &&
           (bVar3 = ShouldIgnoreRequiredFieldCheck(local_188,&this->options_), !bVar3)) {
          pSVar1 = this->scc_analyzer_;
          pDVar11 = FieldDescriptor::message_type(local_188);
          bVar3 = SCCAnalyzer::HasRequiredFields(pSVar1,pDVar11);
          if (bVar3) {
            pFVar12 = FieldDescriptor::options(local_188);
            bVar3 = FieldOptions::weak(pFVar12);
            local_1e1 = 0;
            if ((bVar3) ||
               (pOVar13 = FieldDescriptor::containing_oneof(local_188),
               pOVar13 == (OneofDescriptor *)0x0)) {
              internal::LogMessage::LogMessage
                        (&local_1e0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0x10e6);
              local_1e1 = 1;
              pLVar14 = internal::LogMessage::operator<<
                                  (&local_1e0,
                                   "CHECK failed: !(field->options().weak() || !field->containing_oneof()): "
                                  );
              internal::LogFinisher::operator=(&local_1e2,pLVar14);
            }
            if ((local_1e1 & 1) != 0) {
              internal::LogMessage::~LogMessage(&local_1e0);
            }
            pFVar12 = FieldDescriptor::options(local_188);
            bVar3 = FieldOptions::weak(pFVar12);
            puVar2 = masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (!bVar3) {
              FieldName_abi_cxx11_(&local_208,(cpp *)local_188,field_02);
              io::Printer::Print((Printer *)puVar2,
                                 "if (has_$name$()) {\n  if (!this->$name$().IsInitialized()) return false;\n}\n"
                                 ,"name",&local_208);
              std::__cxx11::string::~string((string *)&local_208);
            }
          }
        }
        io::Printer::Print((Printer *)
                           masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,"break;\n");
        io::Printer::Outdent
                  ((Printer *)
                   masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        io::Printer::Print((Printer *)
                           masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
      }
      psVar15 = OneofDescriptor::name_abi_cxx11_(_j);
      ToUpper(&local_228,psVar15);
      io::Printer::Print((Printer *)puVar2,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n",
                         "cap_oneof_name",&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      io::Printer::Outdent
                ((Printer *)
                 masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      io::Printer::Print((Printer *)
                         masks.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
    }
    oneof._4_4_ = oneof._4_4_ + 1;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateIsInitialized(io::Printer* printer) {
  printer->Print(
    "bool $classname$::IsInitialized() const {\n",
    "classname", classname_);
  printer->Indent();

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!_extensions_.IsInitialized()) {\n"
      "  return false;\n"
      "}\n\n");
  }

  if (HasFieldPresence(descriptor_->file())) {
    // Check that all required fields in this message are set.  We can do this
    // most efficiently by checking 32 "has bits" at a time.
    const std::vector<uint32> masks = RequiredFieldsBitMask();

    for (int i = 0; i < masks.size(); i++) {
      uint32 mask = masks[i];
      if (mask == 0) {
        continue;
      }

      // TODO(ckennelly): Consider doing something similar to ByteSizeLong(),
      // where we check all of the required fields in a single branch (assuming
      // that we aren't going to benefit from early termination).
      printer->Print(
        "if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
        "i", SimpleItoa(i),
        "mask", StrCat(strings::Hex(mask, strings::ZERO_PAD_8)));
    }
  }

  // Now check that all non-oneof embedded messages are initialized.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    // TODO(ckennelly): Push this down into a generator?
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field, options_) &&
        scc_analyzer_->HasRequiredFields(field->message_type())) {
      if (field->is_repeated()) {
        printer->Print(
          "if (!::google::protobuf::internal::AllAreInitialized(this->$name$()))"
          " return false;\n",
          "name", FieldName(field));
      } else if (field->options().weak()) {
        continue;
      } else {
        GOOGLE_CHECK(!field->containing_oneof());
        printer->Print(
            "if (has_$name$()) {\n"
            "  if (!this->$name$_->IsInitialized()) return false;\n"
            "}\n",
            "name", FieldName(field));
      }
    }
  }
  if (num_weak_fields_) {
    // For Weak fields.
    printer->Print("if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  // Go through the oneof fields, emitting a switch if any might have required
  // fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);

    bool has_required_fields = false;
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);

      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        has_required_fields = true;
        break;
      }
    }

    if (!has_required_fields) {
      continue;
    }

    printer->Print(
        "switch ($oneofname$_case()) {\n",
        "oneofname", oneof->name());
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();

      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        GOOGLE_CHECK(!(field->options().weak() || !field->containing_oneof()));
        if (field->options().weak()) {
          // Just skip.
        } else {
          printer->Print(
            "if (has_$name$()) {\n"
            "  if (!this->$name$().IsInitialized()) return false;\n"
            "}\n",
            "name", FieldName(field));
        }
      }

      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(oneof->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}